

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  int *piVar1;
  AssertHelperData *pAVar2;
  pointer pbVar3;
  bool bVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  ulong uVar6;
  ostream *poVar7;
  char *(*extraout_RDX) [8];
  char *(*extraout_RDX_00) [8];
  char *(*extraout_RDX_01) [8];
  char *(*array) [8];
  size_t i;
  ulong uVar8;
  undefined1 *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long lVar10;
  string local_c8 [32];
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  ostream *local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  AssertHelperData *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  AssertHelper local_40;
  allocator<char> local_31;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,(test_property->key_)._M_dataplus._M_p,&local_31);
  bVar4 = std::operator==(xml_element,"testsuites");
  if (bVar4) {
    this = kReservedTestSuitesAttributes;
    array = extraout_RDX;
  }
  else {
    bVar4 = std::operator==(xml_element,"testsuite");
    if (bVar4) {
      this = kReservedTestSuiteAttributes;
      array = extraout_RDX_00;
    }
    else {
      bVar4 = std::operator==(xml_element,"testcase");
      if (!bVar4) {
        internal::GTestLog::GTestLog
                  ((GTestLog *)&local_a8,GTEST_FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest.cc"
                   ,0x93d);
        poVar7 = std::operator<<((ostream *)&std::cerr,"Condition false failed. ");
        poVar7 = std::operator<<(poVar7,"Unrecognized xml_element provided: ");
        std::operator<<(poVar7,(string *)xml_element);
        internal::GTestLog::~GTestLog((GTestLog *)&local_a8);
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        goto LAB_0011b1c1;
      }
      this = kReservedTestCaseAttributes;
      array = extraout_RDX_01;
    }
  }
  ArrayAsVector<8ul>(&local_58,(testing *)this,array);
LAB_0011b1c1:
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_c8);
  pbVar3 = local_58.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar9 = local_58.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var5._M_current !=
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Message::Message((Message *)&local_70);
    local_68 = local_70._M_head_impl;
    poVar7 = (ostream *)(local_70._M_head_impl + 0x10);
    std::operator<<(poVar7,"Reserved key used in RecordProperty(): ");
    std::operator<<(poVar7,local_c8);
    std::operator<<(poVar7," (");
    local_80 = pbVar3;
    local_88 = _Var5._M_current;
    local_78 = poVar7;
    Message::Message((Message *)&local_40);
    local_60 = local_40.data_;
    piVar1 = &(local_40.data_)->line;
    lVar10 = 0;
    for (uVar8 = 0; pAVar2 = local_60,
        uVar6 = (long)local_58.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5, uVar8 < uVar6;
        uVar8 = uVar8 + 1) {
      if ((uVar8 != 0) && (2 < uVar6)) {
        std::operator<<((ostream *)piVar1,", ");
        uVar6 = (long)local_58.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      if (uVar8 == uVar6 - 1) {
        std::operator<<((ostream *)piVar1,"and ");
      }
      std::operator<<((ostream *)piVar1,"\'");
      std::operator<<((ostream *)piVar1,
                      (string *)
                      ((long)&((local_58.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar10));
      std::operator<<((ostream *)piVar1,"\'");
      lVar10 = lVar10 + 0x20;
    }
    internal::StringStreamToString(&local_a8,(stringstream *)local_60);
    poVar7 = local_78;
    pbVar9 = local_80;
    _Var5._M_current = local_88;
    if (pAVar2 != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)pAVar2 + 8))(pAVar2);
    }
    std::operator<<(poVar7,(string *)&local_a8);
    std::operator<<(poVar7," are reserved by ");
    std::operator<<(poVar7,"Google Test");
    std::operator<<(poVar7,")");
    internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest.cc"
               ,0x969,"Failed");
    internal::AssertHelper::operator=(&local_40,(Message *)&local_70);
    internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_68 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::__cxx11::string::~string(local_c8);
  return _Var5._M_current == pbVar9;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}